

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_add_rel_pos_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  float fVar2;
  long lVar3;
  void *__dest;
  void *__src;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  size_t __n;
  long lVar11;
  long lVar12;
  long in_RSI;
  int *in_RDI;
  int64_t j;
  int64_t jdw;
  int64_t jdh;
  float src2_e;
  float src1_e;
  int64_t jp0;
  int64_t i10;
  int64_t jp1;
  int64_t i11;
  int64_t i12;
  int64_t i13;
  int ip1;
  int ip0;
  int dp;
  int np;
  int nth;
  int ith;
  int64_t ne13;
  int64_t ne12;
  int64_t ne11;
  int64_t ne10;
  float *dst_data;
  float *src2_data;
  float *src1_data;
  bool inplace;
  ggml_tensor *src2;
  ggml_tensor *src1;
  ggml_tensor *src0;
  int local_e4;
  long local_d0;
  ggml_threadpool *in_stack_ffffffffffffff40;
  long local_a8;
  long local_98;
  long local_90;
  long local_88;
  
  lVar11 = *(long *)(in_RSI + 0xa0);
  lVar3 = *(long *)(in_RSI + 0xa8);
  if (*(int *)(in_RSI + 0x54) == 0) {
    if (*in_RDI == 0) {
      __dest = *(void **)(in_RSI + 0xf8);
      __src = *(void **)(*(long *)(in_RSI + 0x98) + 0xf8);
      __n = ggml_nbytes(in_RSI);
      memcpy(__dest,__src,__n);
    }
    ggml_barrier(in_stack_ffffffffffffff40);
  }
  lVar4 = *(long *)(lVar11 + 0xf8);
  lVar3 = *(long *)(lVar3 + 0xf8);
  lVar5 = *(long *)(in_RSI + 0xf8);
  lVar6 = *(long *)(lVar11 + 0x10);
  lVar7 = *(long *)(lVar11 + 0x18);
  lVar8 = *(long *)(lVar11 + 0x20);
  local_e4 = (int)*(undefined8 *)(lVar11 + 0x28);
  iVar9 = (local_e4 + in_RDI[1] + -1) / in_RDI[1];
  iVar10 = iVar9 * *in_RDI;
  if (iVar10 + iVar9 < local_e4) {
    local_e4 = iVar10 + iVar9;
  }
  for (local_88 = (long)iVar10; local_88 < local_e4; local_88 = local_88 + 1) {
    for (local_90 = 0; local_90 < lVar8; local_90 = local_90 + 1) {
      for (local_98 = 0; local_98 < lVar7; local_98 = local_98 + 1) {
        for (local_a8 = 0; local_a8 < lVar6; local_a8 = local_a8 + 1) {
          lVar11 = local_88 * lVar8 * lVar7 * lVar6 + local_90 * lVar7 * lVar6 + local_98 * lVar6 +
                   local_a8;
          fVar1 = *(float *)(lVar4 + lVar11 * 4);
          fVar2 = *(float *)(lVar3 + lVar11 * 4);
          for (local_d0 = 0; local_d0 < lVar6; local_d0 = local_d0 + 1) {
            lVar12 = lVar11 * lVar6 + local_d0;
            *(float *)(lVar5 + lVar12 * 4) = fVar2 + *(float *)(lVar5 + lVar12 * 4);
            lVar12 = (lVar11 * lVar6 - (lVar6 + -1) * local_a8) + local_d0 * lVar6;
            *(float *)(lVar5 + lVar12 * 4) = fVar1 + *(float *)(lVar5 + lVar12 * 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_add_rel_pos_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    const bool inplace = (bool) ((int32_t *) dst->op_params)[0];
    if (!inplace) {
        if (params->ith == 0) {
            memcpy((char *) dst->data, (char *) src0->data, ggml_nbytes(dst));
        }
        ggml_barrier(params->threadpool);
    }
    // ref: https://github.com/facebookresearch/segment-anything/blob/main/segment_anything/modeling/image_encoder.py#L357-L359

    float * src1_data = (float *) src1->data;
    float * src2_data = (float *) src2->data;
    float * dst_data  = (float *) dst->data;

    const int64_t ne10 = src1->ne[0];
    const int64_t ne11 = src1->ne[1];
    const int64_t ne12 = src1->ne[2];
    const int64_t ne13 = src1->ne[3];

    const int ith = params->ith;
    const int nth = params->nth;

    // total patches in dst
    const int np = ne13;

    // patches per thread
    const int dp = (np + nth - 1)/nth;

    // patch range for this thread
    const int ip0 = dp*ith;
    const int ip1 = MIN(ip0 + dp, np);

    for (int64_t i13 = ip0; i13 < ip1; ++i13) {
        for (int64_t i12 = 0; i12 < ne12; ++i12) {
            for (int64_t i11 = 0; i11 < ne11; ++i11) {
                const int64_t jp1 = i13*ne12*ne11*ne10 + i12*ne11*ne10 + i11*ne10;
                for (int64_t i10 = 0; i10 < ne10; ++i10) {
                    const int64_t jp0  = jp1 + i10;
                    const float src1_e = src1_data[jp0];
                    const float src2_e = src2_data[jp0];

                    const int64_t jdh = jp0 * ne10;
                    const int64_t jdw = jdh - (ne10 - 1) * i10;

                    for (int64_t j = 0; j < ne10; ++j) {
                        dst_data[jdh + j     ] += src2_e;
                        dst_data[jdw + j*ne10] += src1_e;
                    }
                }
            }
        }
    }
}